

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall detail::writer::operator()(writer *this,string *val)

{
  size_t source_size;
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  void *__dest;
  unsigned_short tmp;
  undefined1 local_12 [2];
  
  uVar2 = (this->buf_).size_;
  if (uVar2 != 0) {
    __n = 2;
    if (uVar2 < 2) {
      __n = uVar2;
    }
    memcpy((this->buf_).data_,local_12,__n);
  }
  uVar2 = (this->buf_).size_;
  uVar1 = 2;
  if (uVar2 < 2) {
    uVar1 = uVar2;
  }
  uVar2 = uVar2 - uVar1;
  __dest = (void *)(uVar1 + (long)(this->buf_).data_);
  (this->buf_).data_ = __dest;
  (this->buf_).size_ = uVar2;
  if (val->_M_string_length <= uVar2) {
    uVar2 = val->_M_string_length;
  }
  if (uVar2 != 0) {
    memcpy(__dest,(val->_M_dataplus)._M_p,uVar2);
  }
  uVar2 = (this->buf_).size_;
  uVar1 = val->_M_string_length;
  if (uVar2 < val->_M_string_length) {
    uVar1 = uVar2;
  }
  (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar1);
  (this->buf_).size_ = uVar2 - uVar1;
  return;
}

Assistant:

void operator()(std::string const& val) const {
        (*this)(static_cast<uint16_t>(val.size()));
        asio::buffer_copy(buf_, asio::buffer(val));
        buf_ = buf_ + val.length();
    }